

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_function.cpp
# Opt level: O3

void Image_Function::Subtract
               (Image *in1,uint32_t startX1,uint32_t startY1,Image *in2,uint32_t startX2,
               uint32_t startY2,Image *out,uint32_t startXOut,uint32_t startYOut,uint32_t width,
               uint32_t height)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  byte bVar4;
  uchar *puVar5;
  undefined4 in_register_00000014;
  EVP_PKEY_CTX *src;
  EVP_PKEY_CTX *src_00;
  uchar *puVar6;
  uchar *puVar7;
  undefined4 in_register_0000008c;
  ulong uVar8;
  uchar uVar9;
  uchar *puVar10;
  uint local_a0;
  uint local_9c;
  Image *local_98;
  undefined8 local_90;
  undefined8 local_88;
  ImageTemplate<unsigned_char> local_80;
  ImageTemplate<unsigned_char> local_58;
  
  local_90 = CONCAT44(in_register_0000008c,startY2);
  local_88 = CONCAT44(in_register_00000014,startY1);
  ParameterValidation<PenguinV_Image::ImageTemplate<unsigned_char>>
            (in1,startX1,startY1,in2,startX2,startY2,out,startXOut,startYOut,width,height);
  local_98 = in2;
  bVar4 = CommonColorCount<PenguinV_Image::ImageTemplate<unsigned_char>>(in1,in2,out);
  local_9c = (uint)bVar4;
  local_a0 = width * local_9c;
  local_58._vptr_ImageTemplate = (_func_int **)&PTR__ImageTemplate_00119d28;
  local_58._data = (uchar *)0x0;
  local_58._type = in1->_type;
  PenguinV_Image::ImageTemplate<unsigned_char>::copy(&local_58,(EVP_PKEY_CTX *)in1,src);
  local_80._vptr_ImageTemplate = (_func_int **)&PTR__ImageTemplate_00119d28;
  local_80._data = (uchar *)0x0;
  local_80._type = out->_type;
  PenguinV_Image::ImageTemplate<unsigned_char>::copy(&local_80,(EVP_PKEY_CTX *)out,src_00);
  OptimiseRoi<PenguinV_Image::ImageTemplate<unsigned_char>,PenguinV_Image::ImageTemplate<unsigned_char>,PenguinV_Image::ImageTemplate<unsigned_char>>
            (&local_a0,&height,in1,&local_58,&local_80);
  local_80._vptr_ImageTemplate = (_func_int **)&PTR__ImageTemplate_00119d28;
  PenguinV_Image::ImageTemplate<unsigned_char>::clear(&local_80);
  local_58._vptr_ImageTemplate = (_func_int **)&PTR__ImageTemplate_00119d28;
  PenguinV_Image::ImageTemplate<unsigned_char>::clear(&local_58);
  uVar1 = out->_rowSize;
  if (height * uVar1 != 0) {
    puVar7 = out->_data + (ulong)(startXOut * local_9c) + (ulong)(startYOut * uVar1);
    uVar2 = local_98->_rowSize;
    puVar5 = puVar7 + height * uVar1;
    puVar6 = local_98->_data + (ulong)(startX2 * local_9c) + (ulong)((int)local_90 * uVar2);
    uVar3 = in1->_rowSize;
    puVar10 = in1->_data + (ulong)(startX1 * local_9c) + (ulong)((int)local_88 * uVar3);
    do {
      if ((ulong)local_a0 != 0) {
        uVar8 = 0;
        do {
          uVar9 = puVar10[uVar8] - puVar6[uVar8];
          if (puVar10[uVar8] < puVar6[uVar8]) {
            uVar9 = '\0';
          }
          puVar7[uVar8] = uVar9;
          uVar8 = uVar8 + 1;
        } while (local_a0 != uVar8);
      }
      puVar7 = puVar7 + uVar1;
      puVar10 = puVar10 + uVar3;
      puVar6 = puVar6 + uVar2;
    } while (puVar7 != puVar5);
  }
  return;
}

Assistant:

void Subtract( const Image & in1, uint32_t startX1, uint32_t startY1, const Image & in2, uint32_t startX2, uint32_t startY2,
                   Image & out, uint32_t startXOut, uint32_t startYOut, uint32_t width, uint32_t height )
    {
        ParameterValidation( in1, startX1, startY1, in2, startX2, startY2, out, startXOut, startYOut, width, height );

        const uint8_t colorCount  = CommonColorCount( in1, in2, out );
        width = width * colorCount;

        OptimiseRoi( width, height, in1, in1, out );

        const uint32_t rowSize1   = in1.rowSize();
        const uint32_t rowSize2   = in2.rowSize();
        const uint32_t rowSizeOut = out.rowSize();

        const uint8_t * in1Y = in1.data() + startY1   * rowSize1   + startX1   * colorCount;
        const uint8_t * in2Y = in2.data() + startY2   * rowSize2   + startX2   * colorCount;
        uint8_t       * outY = out.data() + startYOut * rowSizeOut + startXOut * colorCount;

        const uint8_t * outYEnd = outY + height * rowSizeOut;

        for( ; outY != outYEnd; outY += rowSizeOut, in1Y += rowSize1, in2Y += rowSize2 ) {
            const uint8_t * in1X = in1Y;
            const uint8_t * in2X = in2Y;
            uint8_t       * outX = outY;

            const uint8_t * outXEnd = outX + width;

            for( ; outX != outXEnd; ++outX, ++in1X, ++in2X )
                (*outX) = static_cast<uint8_t>( (*in2X) > (*in1X) ? 0u : (*in1X) - (*in2X) );
        }
    }